

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O0

SimpleStringMemoryBlock * __thiscall
SimpleStringInternalCache::allocateNewCacheBlockFrom
          (SimpleStringInternalCache *this,SimpleStringInternalCacheNode *node)

{
  SimpleStringMemoryBlock *newBlock;
  SimpleStringMemoryBlock *pSVar1;
  SimpleStringMemoryBlock *block;
  SimpleStringInternalCacheNode *node_local;
  SimpleStringInternalCache *this_local;
  
  newBlock = createSimpleStringMemoryBlock(this,node->size_,node->usedMemoryHead_);
  pSVar1 = addToSimpleStringMemoryBlockList(this,newBlock,node->usedMemoryHead_);
  node->usedMemoryHead_ = pSVar1;
  return newBlock;
}

Assistant:

SimpleStringMemoryBlock* SimpleStringInternalCache::allocateNewCacheBlockFrom(SimpleStringInternalCacheNode* node)
{
    SimpleStringMemoryBlock* block = createSimpleStringMemoryBlock(node->size_, node->usedMemoryHead_);
    node->usedMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->usedMemoryHead_);
    return block;
}